

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  int iVar1;
  char *pcVar2;
  char *ret;
  __va_list_tag *argp_local;
  char *fmt_local;
  lua_State *L_local;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x228,
                  "const char *lua_pushvfstring(lua_State *, const char *, struct __va_list_tag *)")
    ;
  }
  pcVar2 = luaO_pushvfstring(L,fmt,argp);
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  iVar1 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar1;
  if (iVar1 == 0) {
    return pcVar2;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x22b,
                "const char *lua_pushvfstring(lua_State *, const char *, struct __va_list_tag *)");
}

Assistant:

LUA_API const char *lua_pushvfstring (lua_State *L, const char *fmt,
                                      va_list argp) {
  const char *ret;
  lua_lock(L);
  ret = luaO_pushvfstring(L, fmt, argp);
  luaC_checkGC(L);
  lua_unlock(L);
  return ret;
}